

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphs.cpp
# Opt level: O2

void __thiscall Graph::readEdgesFromfile(Graph *this,string *inputFile)

{
  char cVar1;
  ostream *poVar2;
  allocator local_319;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  string line;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  ifstream is;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&is,(string *)inputFile,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&is,(string *)&line);
    while ((abStack_218[*(long *)(_is + -0x18)] & 2) == 0) {
      std::__cxx11::string::string((string *)&local_258,(string *)&line);
      std::__cxx11::string::string((string *)&local_278,"\t",&local_319);
      split(&v,&local_258,&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_258);
      if ((long)v.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)v.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x60) {
        std::__cxx11::string::string
                  ((string *)&local_2d8,
                   (string *)
                   v.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::string::string
                  ((string *)&local_298,
                   (string *)
                   (v.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1));
        std::__cxx11::string::string
                  ((string *)&local_2b8,
                   (string *)
                   (v.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 2));
        insertEdge(this,&local_2d8,&local_298,&local_2b8);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&local_2d8);
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&is,(string *)&line)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&v);
    }
    std::ifstream::close();
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::~ifstream(&is);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)inputFile);
  poVar2 = std::operator<<(poVar2,"open failed.");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(100);
}

Assistant:

void Graph::readEdgesFromfile(string inputFile) {
    ifstream is(inputFile);
    string line;

    if (!is.is_open()) {
        cout << inputFile << "open failed." << endl;
        exit(100);
    }

    getline(is, line);

    while (!is.eof()) {
        vector<string> v = split(line, "\t");

        if (v.size() != 3) {
            getline(is, line);
            continue;
        }

        this->insertEdge(v[0], v[1], v[2]);

        getline(is, line);
    }

    is.close();
}